

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * get_compTM(lua_State *L,Table *mt1,Table *mt2,TMS event)

{
  int iVar1;
  TValue *local_60;
  TValue *local_58;
  lua_State *local_50;
  lua_State *local_48;
  TValue *tm2;
  TValue *tm1;
  TMS event_local;
  Table *mt2_local;
  Table *mt1_local;
  lua_State *L_local;
  
  if (mt1 == (Table *)0x0) {
    local_48 = (lua_State *)0x0;
  }
  else {
    if (((uint)mt1->flags & 1 << ((byte)event & 0x1f)) == 0) {
      local_50 = (lua_State *)luaT_gettm(mt1,event,L->l_G->tmname[event]);
    }
    else {
      local_50 = (lua_State *)0x0;
    }
    local_48 = local_50;
  }
  if (local_48 == (lua_State *)0x0) {
    L_local = (lua_State *)0x0;
  }
  else if (mt1 == mt2) {
    L_local = local_48;
  }
  else {
    if (mt2 == (Table *)0x0) {
      local_58 = (TValue *)0x0;
    }
    else {
      if (((uint)mt2->flags & 1 << ((byte)event & 0x1f)) == 0) {
        local_60 = luaT_gettm(mt2,event,L->l_G->tmname[event]);
      }
      else {
        local_60 = (TValue *)0x0;
      }
      local_58 = local_60;
    }
    if (local_58 == (TValue *)0x0) {
      L_local = (lua_State *)0x0;
    }
    else {
      iVar1 = luaO_rawequalObj((TValue *)local_48,local_58);
      if (iVar1 == 0) {
        L_local = (lua_State *)0x0;
      }
      else {
        L_local = local_48;
      }
    }
  }
  return (TValue *)L_local;
}

Assistant:

static const TValue*get_compTM(lua_State*L,Table*mt1,Table*mt2,
TMS event){
const TValue*tm1=fasttm(L,mt1,event);
const TValue*tm2;
if(tm1==NULL)return NULL;
if(mt1==mt2)return tm1;
tm2=fasttm(L,mt2,event);
if(tm2==NULL)return NULL;
if(luaO_rawequalObj(tm1,tm2))
return tm1;
return NULL;
}